

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t size;
  size_t attempt_count;
  size_t spread;
  char *pcVar1;
  typed_value<unsigned_long,_char> *ptVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  size_type sVar4;
  ostream *poVar5;
  any *paVar6;
  unsigned_long *puVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *type;
  pointer type_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  variables_map vm;
  options_description description;
  basic_parsed_options<char> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  unsigned_long local_180;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  undefined8 local_150 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_140 [144];
  options_description local_b0 [128];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_150,anon_var_dwarf_1397c,(allocator<char> *)&local_1c0);
  boost::program_options::options_description::options_description
            (local_b0,(string *)local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_150);
  local_150[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_150,"help,h");
  ptVar2 = boost::program_options::value<unsigned_long>();
  local_1c0.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)&local_1c0);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x10c36e,(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>();
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x3e8;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)&local_198);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"attempts",(char *)ptVar2);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  ptVar3->m_multitoken = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"type",(char *)ptVar3);
  ptVar2 = boost::program_options::value<unsigned_long>();
  local_180 = 1;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,&local_180);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"spread",(char *)ptVar2);
  boost::program_options::variables_map::variables_map((variables_map *)local_150);
  local_178.super_function_base.vtable = (vtable_base *)0x0;
  local_178.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_178.super_function_base.functor._8_8_ = 0;
  local_178.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>(&local_1c0,argc,argv,local_b0,0,&local_178);
  boost::program_options::store((basic_parsed_options *)&local_1c0,(variables_map *)local_150,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_1c0.options);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_178);
  boost::program_options::notify((variables_map *)local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"help",(allocator<char> *)&local_198);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_140,(key_type *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (sVar4 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"size",(allocator<char> *)&local_198);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    size = *puVar7;
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"attempts",(allocator<char> *)&local_198);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    attempt_count = *puVar7;
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"type",(allocator<char> *)&local_180);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    __x = boost::
          any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                    (paVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_198,__x);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"spread",(allocator<char> *)&local_180);
    paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    puVar7 = boost::any_cast<unsigned_long_const&>(paVar6);
    spread = *puVar7;
    std::__cxx11::string::~string((string *)&local_1c0);
    test_dyntuple_access(size,attempt_count);
    test_vector_access(size,attempt_count);
    for (type_00 = local_198.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        type_00 !=
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; type_00 = type_00 + 1) {
      test_pointer_array_access(size,attempt_count,type_00,spread);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
  }
  else {
    poVar5 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_b0);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_150);
  boost::program_options::options_description::~options_description(local_b0);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("size", bpo::value<std::size_t>()->default_value(1000),
            "Размер испытываемых массивов.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("type", bpo::value<std::vector<std::string>>()->multitoken(),
            "Типы массива указателей.\nДопустимые значения: plain, sparse, shuffled.")
        ("spread", bpo::value<std::size_t>()->default_value(1),
            "Степень разреженности массива указателей.\n"
            "Создаёт массив указателей размера `size * spread`, который затем, в зависимости от "
            "выбранного типа массива, либо прореживается, либо перемешивается.\n"
            "В случае с простым (plain) массивом опция игнорируется.");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto size = vm["size"].as<std::size_t>();
            auto attempts = vm["attempts"].as<std::size_t>();
            auto types = vm["type"].as<std::vector<std::string>>();
            auto spread = vm["spread"].as<std::size_t>();

            test_dyntuple_access(size, attempts);
            test_vector_access(size, attempts);
            for (const auto & type: types)
            {
                test_pointer_array_access(size, attempts, type, spread);
            }
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}